

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O3

JavascriptArray * __thiscall
JsrtDebugStackFrames::StackFrames(JsrtDebugStackFrames *this,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  void *context;
  ScriptContext *this_00;
  DiagStackFrame *this_01;
  code *pcVar2;
  bool bVar3;
  BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  ArenaAllocator *pAVar4;
  long *buffer;
  JavascriptArray *pJVar5;
  undefined4 *puVar6;
  DynamicObject *value;
  Var newValue;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_03;
  uint32 length;
  long lVar7;
  
  pTVar1 = scriptContext->threadContext;
  context = pTVar1->debugManager->dispatchHaltFrameAddress;
  if (context != (void *)0x0) {
    if (this->framesDictionary == (FramesDictionary *)0x0) {
      pAVar4 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
      this_02 = (BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::ArenaAllocator>(0x38,pAVar4,0x364470);
      pAVar4 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
      JsUtil::
      BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_02,pAVar4,10);
      this->framesDictionary = this_02;
    }
    else {
      ClearFrameDictionary(this);
    }
    pAVar4 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    length = 0;
    buffer = (long *)new<Memory::ArenaAllocator>(0x30,pAVar4,0x364470);
    pAVar4 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    buffer[3] = (long)pAVar4;
    *buffer = (long)&PTR_IsReadOnly_014d03b8;
    buffer[1] = 0;
    *(undefined4 *)(buffer + 2) = 0;
    buffer[4] = 0xa00000000;
    this_00 = pTVar1->scriptContextList;
    if (this_00 != (ScriptContext *)0x0) {
      bVar3 = Js::ScriptContext::IsScriptContextInDebugMode(this_00);
      if (bVar3) {
        Js::ScriptContext::GetDebugContext(this_00);
      }
      if ((long)(int)buffer[2] == 0) {
        length = 0;
      }
      else {
        JsUtil::
        QuickSort<Memory::_no_write_barrier_policy,_char,_int_(*)(void_*,_const_void_*,_const_void_*)>
        ::Sort((char *)buffer[1],(long)(int)buffer[2],8,DiagStackFrameSorter,context);
        length = *(uint32 *)(buffer + 2);
      }
    }
    pJVar5 = Js::JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,length,length);
    if (0 < (int)buffer[2]) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar7 = 0;
      do {
        this_01 = *(DiagStackFrame **)(buffer[1] + lVar7 * 8);
        if (lVar7 == 0) {
          bVar3 = Js::DiagStackFrame::IsTopFrame(this_01);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                               ,0x399,"(index != 0 || stackFrame->IsTopFrame())",
                               "Index 0 frame is not marked as top frame");
            if (!bVar3) goto LAB_003aad9f;
            *puVar6 = 0;
          }
        }
        value = GetStackFrame(this,this_01,(uint)lVar7);
        newValue = Js::CrossSite::MarshalVar(scriptContext,value,false);
        Js::JavascriptArray::DirectSetItemAt<void*>(pJVar5,(uint)lVar7,newValue);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)buffer[2]);
    }
    this_03 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    (**(code **)(*buffer + 0x10))(buffer);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (this_03,buffer,0x30);
    return pJVar5;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                     ,0x36a,"(dispatchHaltFrameAddress > 0)",
                     "Didn\'t set the dispatchHaltFrameAddress at time of break?");
  if (bVar3) {
    *puVar6 = 0;
    pJVar5 = Js::JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,0,0);
    return pJVar5;
  }
LAB_003aad9f:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

Js::JavascriptArray * JsrtDebugStackFrames::StackFrames(Js::ScriptContext * scriptContext)
{
    Js::JavascriptArray* stackTraceArray = nullptr;

    ThreadContext* threadContext = scriptContext->GetThreadContext();

    DWORD_PTR dispatchHaltFrameAddress = threadContext->GetDebugManager()->GetDispatchHaltFrameAddress();
    AssertMsg(dispatchHaltFrameAddress > 0, "Didn't set the dispatchHaltFrameAddress at time of break?");

    if (dispatchHaltFrameAddress != 0)
    {
        if (this->framesDictionary == nullptr)
        {
            this->framesDictionary = Anew(this->jsrtDebugManager->GetDebugObjectArena(), FramesDictionary, this->jsrtDebugManager->GetDebugObjectArena(), 10);
        }
        else
        {
            this->ClearFrameDictionary();
        }

        typedef JsUtil::List<Js::DiagStackFrame*, ArenaAllocator> DiagStackFrameList;
        DiagStackFrameList* stackList = Anew(this->jsrtDebugManager->GetDebugObjectArena(), DiagStackFrameList, this->jsrtDebugManager->GetDebugObjectArena(), 10);

        // Walk all the script contexts and collect the frames which are below the address when break was reported.
        for (Js::ScriptContext *tempScriptContext = threadContext->GetScriptContextList();
        tempScriptContext != nullptr && tempScriptContext->IsScriptContextInDebugMode();
            tempScriptContext = tempScriptContext->next)
        {
            Js::WeakDiagStack * framePointers = tempScriptContext->GetDebugContext()->GetProbeContainer()->GetFramePointers(dispatchHaltFrameAddress);
            if (framePointers != nullptr)
            {
                Js::DiagStack* stackFrames = framePointers->GetStrongReference();
                if (stackFrames != nullptr)
                {
                    int count = stackFrames->Count();
                    for (int frameIndex = 0; frameIndex < count; ++frameIndex)
                    {
                        Js::DiagStackFrame* stackFrame = stackFrames->Peek(frameIndex);
                        stackList->Add(stackFrame);
                    }
                }

                framePointers->ReleaseStrongReference();
                HeapDelete(framePointers);
            }
        }

        // Frames can be from multiple contexts, sort them based on stack address
        stackList->Sort(DiagStackFrameSorter, (void*)dispatchHaltFrameAddress);

        stackTraceArray = scriptContext->GetLibrary()->CreateArray(stackList->Count(), stackList->Count());

        stackList->Map([&](int index, Js::DiagStackFrame* stackFrame)
        {
            AssertMsg(index != 0 || stackFrame->IsTopFrame(), "Index 0 frame is not marked as top frame");
            Js::DynamicObject* stackTraceObject = this->GetStackFrame(stackFrame, index);
            Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, stackTraceObject);
            stackTraceArray->DirectSetItemAt(index, marshaledObj);
        });

        Adelete(this->jsrtDebugManager->GetDebugObjectArena(), stackList);
    }
    else
    {
        // Empty array
        stackTraceArray = scriptContext->GetLibrary()->CreateArray(0, 0);
    }

    return stackTraceArray;
}